

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O2

double __thiscall
amrex::BaseFab<double>::min<(amrex::RunOn)0>(BaseFab<double> *this,Box *subbox,int comp)

{
  Box *pBVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double r;
  double local_78;
  anon_class_72_2_94732018 local_70;
  
  local_70.r = &local_78;
  pBVar1 = &this->domain;
  local_70.a.begin.z = (this->domain).smallend.vect[2];
  local_70.a.begin.x = (pBVar1->smallend).vect[0];
  local_70.a.begin.y = (pBVar1->smallend).vect[1];
  lVar3 = (long)(this->domain).bigend.vect[1] + 1;
  iVar2 = (this->domain).bigend.vect[0];
  lVar4 = (long)(this->domain).bigend.vect[2] + 1;
  local_70.a.jstride = ((long)iVar2 - (long)(pBVar1->smallend).vect[0]) + 1;
  local_70.a.kstride = (lVar3 - (this->domain).smallend.vect[1]) * local_70.a.jstride;
  local_70.a.nstride = (lVar4 - local_70.a.begin.z) * local_70.a.kstride;
  local_70.a.p = this->dptr + local_70.a.nstride * comp;
  local_70.a.end._0_8_ = (ulong)(iVar2 + 1) | lVar3 << 0x20;
  local_70.a.ncomp = this->nvar - comp;
  local_78 = 1.79769313486232e+308;
  local_70.a.end.z = (int)lVar4;
  LoopOnCpu<amrex::BaseFab<double>::min<(amrex::RunOn)0>(amrex::Box_const&,int)const::_lambda(int,int,int)_1_>
            (subbox,&local_70);
  return local_78;
}

Assistant:

T
BaseFab<T>::min (const Box& subbox, int comp) const noexcept
{
    Array4<T const> const& a = this->const_array(comp);
#ifdef AMREX_USE_GPU
    if (run_on == RunOn::Device && Gpu::inLaunchRegion()) {
        ReduceOps<ReduceOpMin> reduce_op;
        ReduceData<T> reduce_data(reduce_op);
        using ReduceTuple = typename decltype(reduce_data)::Type;
        reduce_op.eval(subbox, reduce_data,
        [=] AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            return { a(i,j,k) };
        });
        ReduceTuple hv = reduce_data.value(reduce_op);
        return amrex::get<0>(hv);
    } else
#endif
    {
        T r = std::numeric_limits<T>::max();
        amrex::LoopOnCpu(subbox, [=,&r] (int i, int j, int k) noexcept
        {
            r = amrex::min(r, a(i,j,k));
        });
        return r;
    }
}